

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O1

void __thiscall
test::iu_PeepTest_x_iutest_x_ScopedPeep_Test::Body(iu_PeepTest_x_iutest_x_ScopedPeep_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  *(undefined4 *)
   (prod_test::s_prod +
   iutest::detail::peep_tag<test::iu_peep_tag_m_z<test::prod_test::ProdClass>>::value) = 4;
  local_1a0._0_4_ = 4;
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       prod_test::s_prod._8_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x335841,"prod_test::s_prod.GetZ()",local_1a0,(int *)&local_1d0,
             in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x146;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  paVar1 = &local_1f8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1a0._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x335841,
             "(prod_test::s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_z<prod_test::ProdClass> >::value)"
             ,local_1a0,
             (int *)(prod_test::s_prod +
                    iutest::detail::peep_tag<test::iu_peep_tag_m_z<test::prod_test::ProdClass>>::
                    value),in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x148;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  *(undefined4 *)
   (prod_test::s_prod +
   iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::value) = 4;
  local_1a0._0_4_ = 4;
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       prod_test::s_prod._4_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x335841,"prod_test::s_prod.GetX()",local_1a0,(int *)&local_1d0,
             in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x14c;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1a0._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x335841,
             "(prod_test::s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_x<prod_test::ProdClass> >::value)"
             ,local_1a0,
             (int *)(prod_test::s_prod +
                    iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::
                    value),in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x14e;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(PeepTest, ScopedPeep)
{
    // マクロ版
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetZ());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z));
    }
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetX());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x));
    }
}